

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

reference __thiscall
absl::
InlinedVector<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
::back(InlinedVector<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
       *this)

{
  reference ppCVar1;
  CordRep **ppCVar2;
  ulong uVar3;
  ulong uVar4;
  Data *pDVar5;
  undefined8 *in_RSI;
  size_type __n;
  CordRep **ppCStack_50;
  SizeType<std::allocator<absl::cord_internal::CordRep_*>_> SStack_48;
  undefined8 *puStack_40;
  
  uVar3 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  if (1 < uVar3) {
    if ((uVar3 & 1) == 0) {
      pDVar5 = &(this->storage_).data_;
    }
    else {
      pDVar5 = (Data *)(this->storage_).data_.allocated.allocated_data;
    }
    return (reference)((long)pDVar5 + (uVar3 & 0xfffffffffffffffe) * 4 + -8);
  }
  InlinedVector<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>::
  back();
  uVar3 = (this->storage_).metadata_.
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  uVar4 = 2;
  if ((uVar3 & 1) != 0) {
    uVar4 = (this->storage_).data_.allocated.allocated_capacity;
  }
  if (uVar3 >> 1 == uVar4) {
    uVar3 = (this->storage_).metadata_.
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
    pDVar5 = (Data *)(this->storage_).data_.allocated.allocated_data;
    uVar4 = uVar3 >> 1;
    ppCStack_50 = (CordRep **)0x0;
    SStack_48 = 0;
    __n = 4;
    if ((uVar3 & 1) != 0) {
      __n = (this->storage_).data_.allocated.allocated_capacity * 2;
    }
    puStack_40 = in_RSI;
    ppCVar2 = __gnu_cxx::new_allocator<absl::cord_internal::CordRep_*>::allocate
                        ((new_allocator<absl::cord_internal::CordRep_*> *)&ppCStack_50,__n,
                         (void *)0x0);
    ppCVar2[uVar4] = (CordRep *)*puStack_40;
    if (1 < uVar3) {
      if ((uVar3 & 1) == 0) {
        pDVar5 = &(this->storage_).data_;
      }
      uVar3 = 0;
      do {
        ppCVar2[uVar3] =
             *(Pointer<std::allocator<absl::cord_internal::CordRep_*>_>)((long)pDVar5 + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    ppCStack_50 = ppCVar2;
    SStack_48 = __n;
    if (((this->storage_).metadata_.
         super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
         .super_Storage<unsigned_long,_1UL,_false>.value & 1) != 0) {
      operator_delete((this->storage_).data_.allocated.allocated_data,
                      (this->storage_).data_.allocated.allocated_capacity << 3);
    }
    (this->storage_).data_.allocated.allocated_data = ppCStack_50;
    (this->storage_).data_.allocated.allocated_capacity = SStack_48;
    (this->storage_).metadata_.
    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    .super_Storage<unsigned_long,_1UL,_false>.value =
         ((this->storage_).metadata_.
          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value | 1) + 2;
    return ppCVar2 + uVar4;
  }
  if ((uVar3 & 1) == 0) {
    pDVar5 = &(this->storage_).data_;
  }
  else {
    pDVar5 = (Data *)(this->storage_).data_.allocated.allocated_data;
  }
  ppCVar1 = (reference)((long)pDVar5 + (uVar3 >> 1) * 8);
  *ppCVar1 = (ValueType<std::allocator<absl::cord_internal::CordRep_*>_>)*in_RSI;
  (this->storage_).metadata_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value = uVar3 + 2;
  return ppCVar1;
}

Assistant:

SizeType<A> GetSize() const { return GetSizeAndIsAllocated() >> 1; }